

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

word Sbd_ManSolverSupp(Vec_Int_t *vSop,int *pInds,int *pnVars)

{
  int iVar1;
  int iVar2;
  int local_34;
  int nVars;
  int Entry;
  int i;
  word Supp;
  int *pnVars_local;
  int *pInds_local;
  Vec_Int_t *vSop_local;
  
  _Entry = 0;
  local_34 = 0;
  nVars = 0;
  do {
    iVar1 = Vec_IntSize(vSop);
    if (iVar1 <= nVars) {
      *pnVars = local_34;
      return _Entry;
    }
    iVar1 = Vec_IntEntry(vSop,nVars);
    if (iVar1 != -1) {
      iVar2 = Abc_Lit2Var(iVar1);
      if (0x3f < iVar2) {
        __assert_fail("Abc_Lit2Var(Entry) < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdWin.c"
                      ,0x14f,"word Sbd_ManSolverSupp(Vec_Int_t *, int *, int *)");
      }
      iVar2 = Abc_Lit2Var(iVar1);
      if ((_Entry >> ((byte)iVar2 & 0x3f) & 1) == 0) {
        iVar2 = Abc_Lit2Var(iVar1);
        pInds[iVar2] = local_34;
        iVar1 = Abc_Lit2Var(iVar1);
        _Entry = 1L << ((byte)iVar1 & 0x3f) | _Entry;
        local_34 = local_34 + 1;
      }
    }
    nVars = nVars + 1;
  } while( true );
}

Assistant:

word Sbd_ManSolverSupp( Vec_Int_t * vSop, int * pInds, int * pnVars )
{
    word Supp = 0;
    int i, Entry, nVars = 0;
    Vec_IntForEachEntry( vSop, Entry, i )
    {
        if ( Entry == -1 )
            continue;
        assert( Abc_Lit2Var(Entry) < 64 );
        if ( (Supp >> Abc_Lit2Var(Entry)) & 1 )
            continue;
        pInds[Abc_Lit2Var(Entry)] = nVars++;
        Supp |= (word)1 << Abc_Lit2Var(Entry);
    }
    *pnVars = nVars;
    return Supp;
}